

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.hxx
# Opt level: O0

void __thiscall nuraft::peer::set_snapshot_in_sync(peer *this,ptr<snapshot> *s,ulong timeout_ms)

{
  bool bVar1;
  int32 iVar2;
  shared_ptr<nuraft::snapshot_sync_ctx> *in_RSI;
  __shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  lock_guard<std::mutex> l;
  mutex_type *in_stack_ffffffffffffff98;
  shared_ptr<nuraft::snapshot> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (bVar1) {
    std::__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::reset(in_RDI);
  }
  else {
    iVar2 = get_id((peer *)0x225b69);
    cs_new<nuraft::snapshot_sync_ctx,std::shared_ptr<nuraft::snapshot>const&,int,unsigned_long&>
              ((shared_ptr<nuraft::snapshot> *)CONCAT44(iVar2,in_stack_ffffffffffffffa8),
               (int *)in_RSI,(unsigned_long *)in_stack_ffffffffffffff98);
    std::shared_ptr<nuraft::snapshot_sync_ctx>::operator=
              (in_RSI,(shared_ptr<nuraft::snapshot_sync_ctx> *)in_stack_ffffffffffffff98);
    std::shared_ptr<nuraft::snapshot_sync_ctx>::~shared_ptr
              ((shared_ptr<nuraft::snapshot_sync_ctx> *)0x225bb2);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x225bd8);
  return;
}

Assistant:

void set_snapshot_in_sync(const ptr<snapshot>& s,
                              ulong timeout_ms = 10 * 1000) {
        std::lock_guard<std::mutex> l(snp_sync_ctx_lock_);
        if (s == nilptr) {
            snp_sync_ctx_.reset();
        }
        else {
            snp_sync_ctx_ = cs_new<snapshot_sync_ctx>(s, get_id(), timeout_ms);
        }
    }